

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::ExtensionGenerator::GenerateStaticVariablesInitialization
          (ExtensionGenerator *this,Printer *printer)

{
  bool bVar1;
  ObjectiveCType OVar2;
  mapped_type *pmVar3;
  Descriptor *this_00;
  EnumDescriptor *this_01;
  int i;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  EnumDescriptor *descriptor_01;
  FieldDescriptor *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  allocator<char> local_131;
  string type;
  allocator<char> local_109;
  string singular_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_40;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&singular_type,"root_class_and_method_name",(allocator<char> *)&type);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&singular_type);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::~string((string *)&singular_type);
  ClassName_abi_cxx11_(&singular_type,*(objectivec **)(this->descriptor_ + 0x58),descriptor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,"extended_type",(allocator<char> *)&local_e8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&type);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&singular_type);
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&singular_type);
  SimpleItoa_abi_cxx11_(&singular_type,(protobuf *)(ulong)*(uint *)(this->descriptor_ + 0x38),i);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,"number",(allocator<char> *)&local_e8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&type);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&singular_type);
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&singular_type);
  options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_02 = this->descriptor_;
  if (*(int *)(this_02 + 0x4c) == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&singular_type,"GPBExtensionRepeated",(allocator<char> *)&type);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&options,
               &singular_type);
    std::__cxx11::string::~string((string *)&singular_type);
    this_02 = this->descriptor_;
  }
  bVar1 = FieldDescriptor::is_packed(this_02);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&singular_type,"GPBExtensionPacked",(allocator<char> *)&type);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&options,
               &singular_type);
    std::__cxx11::string::~string((string *)&singular_type);
  }
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x58) + 0x20) + 0x68) == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&singular_type,"GPBExtensionSetWireFormat",(allocator<char> *)&type);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&options,
               &singular_type);
    std::__cxx11::string::~string((string *)&singular_type);
  }
  BuildFlagsString(&singular_type,FLAGTYPE_EXTENSION,&options);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,"options",(allocator<char> *)&local_e8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&type);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&singular_type);
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&singular_type);
  OVar2 = GetObjectiveCType(this->descriptor_);
  singular_type._M_dataplus._M_p = (pointer)&singular_type.field_2;
  singular_type._M_string_length = 0;
  singular_type.field_2._M_local_buf[0] = '\0';
  if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"GPBStringifySymbol(",&local_131);
    this_00 = FieldDescriptor::message_type(this->descriptor_);
    ClassName_abi_cxx11_(&local_a8,(objectivec *)this_00,descriptor_00);
    std::operator+(&local_e8,&local_c8,&local_a8);
    std::operator+(&type,&local_e8,")");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"type",&local_109);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_40);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&type);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_a8);
    pbVar4 = &local_c8;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"type",(allocator<char> *)&local_e8);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&type);
    std::__cxx11::string::assign((char *)pmVar3);
    pbVar4 = &type;
  }
  std::__cxx11::string::~string((string *)pbVar4);
  GPBGenericValueFieldName_abi_cxx11_(&type,(objectivec *)this->descriptor_,field);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"default_name",(allocator<char> *)&local_c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_e8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&type);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&type);
  if (*(int *)((objectivec *)this->descriptor_ + 0x4c) == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"default",(allocator<char> *)&local_e8);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&type);
    std::__cxx11::string::assign((char *)pmVar3);
  }
  else {
    DefaultValue_abi_cxx11_(&type,(objectivec *)this->descriptor_,field_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"default",(allocator<char> *)&local_c8);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_e8);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&type);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  std::__cxx11::string::~string((string *)&type);
  GetCapitalizedType_abi_cxx11_(&type,(objectivec *)this->descriptor_,field_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"GPBDataType",(allocator<char> *)&local_40);
  std::operator+(&local_e8,&local_c8,&type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"extension_type",&local_131);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_a8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (OVar2 == OBJECTIVECTYPE_ENUM) {
    this_01 = FieldDescriptor::enum_type(this->descriptor_);
    EnumName_abi_cxx11_(&local_c8,(objectivec *)this_01,descriptor_01);
    std::operator+(&local_e8,&local_c8,"_EnumDescriptor");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"enum_desc_func_name",(allocator<char> *)&local_40);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_a8);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_e8);
    pbVar4 = &local_c8;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"enum_desc_func_name",(allocator<char> *)&local_c8);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_e8);
    std::__cxx11::string::assign((char *)pmVar3);
    pbVar4 = &local_e8;
  }
  std::__cxx11::string::~string((string *)pbVar4);
  io::Printer::Print(printer,&vars,
                     "{\n  .defaultValue.$default_name$ = $default$,\n  .singletonName = GPBStringifySymbol($root_class_and_method_name$),\n  .extendedClass = GPBStringifySymbol($extended_type$),\n  .messageOrGroupClassName = $type$,\n  .enumDescriptorFunc = $enum_desc_func_name$,\n  .fieldNumber = $number$,\n  .dataType = $extension_type$,\n  .options = $options$,\n},\n"
                    );
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&singular_type);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&options);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void ExtensionGenerator::GenerateStaticVariablesInitialization(
    io::Printer* printer) {
  map<string, string> vars;
  vars["root_class_and_method_name"] = root_class_and_method_name_;
  vars["extended_type"] = ClassName(descriptor_->containing_type());
  vars["number"] = SimpleItoa(descriptor_->number());

  std::vector<string> options;
  if (descriptor_->is_repeated()) options.push_back("GPBExtensionRepeated");
  if (descriptor_->is_packed()) options.push_back("GPBExtensionPacked");
  if (descriptor_->containing_type()->options().message_set_wire_format())
    options.push_back("GPBExtensionSetWireFormat");

  vars["options"] = BuildFlagsString(FLAGTYPE_EXTENSION, options);

  ObjectiveCType objc_type = GetObjectiveCType(descriptor_);
  string singular_type;
  if (objc_type == OBJECTIVECTYPE_MESSAGE) {
    vars["type"] = string("GPBStringifySymbol(") +
                   ClassName(descriptor_->message_type()) + ")";
  } else {
    vars["type"] = "NULL";
  }

  vars["default_name"] = GPBGenericValueFieldName(descriptor_);
  if (descriptor_->is_repeated()) {
    vars["default"] = "nil";
  } else {
    vars["default"] = DefaultValue(descriptor_);
  }
  string type = GetCapitalizedType(descriptor_);
  vars["extension_type"] = string("GPBDataType") + type;

  if (objc_type == OBJECTIVECTYPE_ENUM) {
    vars["enum_desc_func_name"] =
         EnumName(descriptor_->enum_type()) + "_EnumDescriptor";
  } else {
    vars["enum_desc_func_name"] = "NULL";
  }

  printer->Print(vars,
                 "{\n"
                 "  .defaultValue.$default_name$ = $default$,\n"
                 "  .singletonName = GPBStringifySymbol($root_class_and_method_name$),\n"
                 "  .extendedClass = GPBStringifySymbol($extended_type$),\n"
                 "  .messageOrGroupClassName = $type$,\n"
                 "  .enumDescriptorFunc = $enum_desc_func_name$,\n"
                 "  .fieldNumber = $number$,\n"
                 "  .dataType = $extension_type$,\n"
                 "  .options = $options$,\n"
                 "},\n");
}